

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi.cpp
# Opt level: O2

int opn2_generateFormat(OPN2_MIDIPlayer *device,int sampleCount,OPN2_UInt8 *out_left,
                       OPN2_UInt8 *out_right,OPNMIDI_AudioFormat *format)

{
  int32_t *src;
  unsigned_long uVar1;
  double dVar2;
  uint uVar3;
  OPNMIDI_SampleType OVar4;
  uint sampleOffset;
  OPNMIDIplay *this;
  OPN2 *pOVar5;
  OPNChipBase *pOVar6;
  long *plVar7;
  int iVar8;
  size_t i;
  ulong uVar9;
  code *pcVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  code *transform;
  ulong uVar15;
  size_t i_1;
  ulong uVar16;
  long lVar17;
  bool bVar18;
  double dVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double s;
  double local_80;
  
  uVar14 = sampleCount - sampleCount % 2;
  iVar8 = 0;
  if (device != (OPN2_MIDIPlayer *)0x0 && -1 < (int)uVar14) {
    this = (OPNMIDIplay *)device->opn2_midiPlayer;
    if (this == (OPNMIDIplay *)0x0) {
      __assert_fail("player",
                    "/workspace/llm4binary/github/license_c_cmakelists/jpcima[P]adljack/thirdparty/libOPNMIDI/src/opnmidi.cpp"
                    ,0x4e8,
                    "int opn2_generateFormat(struct OPN2_MIDIPlayer *, int, OPN2_UInt8 *, OPN2_UInt8 *, const OPNMIDI_AudioFormat *)"
                   );
    }
    uVar1 = (this->m_setup).PCM_RATE;
    local_80 = (double)(uVar14 >> 1) /
               (((double)CONCAT44(0x45300000,(int)(uVar1 >> 0x20)) - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    src = this->m_outBuf;
    uVar9 = (ulong)uVar14;
    uVar16 = 0;
    for (; 0 < (int)uVar14; uVar14 = uVar14 - (int)uVar12) {
      uVar1 = (this->m_setup).PCM_RATE;
      uVar20 = (undefined4)uVar1;
      uVar21 = (undefined4)(uVar1 >> 0x20);
      if (local_80 <= 0.0) {
        dVar19 = ((double)CONCAT44(0x45300000,uVar21) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar20) - 4503599627370496.0);
        local_80 = (double)(uVar14 >> 1) / dVar19;
      }
      else {
        dVar19 = ((double)CONCAT44(0x45300000,uVar21) - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,uVar20) - 4503599627370496.0);
      }
      dVar2 = (this->m_setup).maxdelay;
      s = local_80;
      if (dVar2 <= local_80) {
        s = dVar2;
      }
      dVar19 = dVar19 * s + (this->m_setup).carry;
      uVar12 = (ulong)dVar19;
      (this->m_setup).carry = dVar19 - (double)(long)uVar12;
      uVar13 = (ulong)(uVar14 >> 1);
      if ((long)uVar12 < (long)(ulong)(uVar14 >> 1)) {
        uVar13 = uVar12;
      }
      uVar12 = 0x200;
      if ((long)uVar13 < 0x200) {
        uVar12 = uVar13;
      }
      memset(src,0,uVar12 * 8);
      pOVar5 = (this->m_synth).m_p;
      uVar3 = pOVar5->m_numChips;
      if ((ulong)uVar3 == 1) {
        pOVar6 = ((pOVar5->m_chips).
                  super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_p;
        (*pOVar6->_vptr_OPNChipBase[0x12])(pOVar6,src,uVar12);
      }
      else {
        for (lVar17 = 0; (ulong)uVar3 << 4 != lVar17; lVar17 = lVar17 + 0x10) {
          plVar7 = *(long **)((long)&((pOVar5->m_chips).
                                      super__Vector_base<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>,_std::allocator<AdlMIDI_SPtr<OPNChipBase,_ADLMIDI_DefaultDelete<OPNChipBase>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->m_p + lVar17);
          (**(code **)(*plVar7 + 0x98))(plVar7,src,uVar12);
        }
      }
      uVar12 = uVar12 * 2;
      if (uVar13 == 0) goto LAB_0015247f;
      uVar13 = uVar9 - uVar16;
      if (uVar12 < uVar9 - uVar16) {
        uVar13 = uVar12;
      }
      OVar4 = format->type;
      if (OPNMIDI_SampleType_U32 < OVar4) {
        return 0;
      }
      uVar3 = format->containerSize;
      sampleOffset = format->sampleOffset;
      uVar15 = (ulong)sampleOffset;
      lVar17 = (uVar16 >> 1) * uVar15;
      switch(OVar4) {
      default:
        if (uVar3 == 4) {
          for (uVar11 = 0; uVar13 >> 1 != uVar11; uVar11 = uVar11 + 1) {
            *(int32_t *)(out_left + lVar17) = this->m_outBuf[uVar11 * 2];
            *(int32_t *)(out_right + lVar17) = this->m_outBuf[uVar11 * 2 + 1];
            lVar17 = lVar17 + uVar15;
          }
        }
        else {
          if (uVar3 != 2) {
            return 0;
          }
          transform = opn2_cvtU16;
          if (OVar4 == OPNMIDI_SampleType_S16) {
            transform = opn2_cvtS16;
          }
LAB_0015247a:
          CopySamplesTransformed<short,int>
                    (out_left + lVar17,out_right + lVar17,src,uVar13 >> 1,sampleOffset,transform);
        }
        break;
      case OPNMIDI_SampleType_S8:
      case OPNMIDI_SampleType_U8:
        transform = opn2_cvtU8;
        if (OVar4 == OPNMIDI_SampleType_S8) {
          transform = opn2_cvtS8;
        }
        if (uVar3 != 4) {
          if (uVar3 == 2) goto LAB_0015247a;
          if (uVar3 != 1) {
            return 0;
          }
          for (uVar11 = 0; uVar13 >> 1 != uVar11; uVar11 = uVar11 + 1) {
            iVar8 = (*transform)(this->m_outBuf[uVar11 * 2]);
            out_left[lVar17] = (OPN2_UInt8)iVar8;
            iVar8 = (*transform)(this->m_outBuf[uVar11 * 2 + 1]);
            out_right[lVar17] = (OPN2_UInt8)iVar8;
            lVar17 = lVar17 + uVar15;
          }
          break;
        }
        goto LAB_001522f2;
      case OPNMIDI_SampleType_F32:
        if (uVar3 != 4) {
          return 0;
        }
        for (uVar11 = 0; uVar13 >> 1 != uVar11; uVar11 = uVar11 + 1) {
          *(float *)(out_left + lVar17) = (float)this->m_outBuf[uVar11 * 2] * 3.051851e-05;
          *(float *)(out_right + lVar17) = (float)this->m_outBuf[uVar11 * 2 + 1] * 3.051851e-05;
          lVar17 = lVar17 + uVar15;
        }
        break;
      case OPNMIDI_SampleType_F64:
        if (uVar3 != 8) {
          return 0;
        }
        for (uVar11 = 0; uVar13 >> 1 != uVar11; uVar11 = uVar11 + 1) {
          *(double *)(out_left + lVar17) =
               (double)this->m_outBuf[uVar11 * 2] * 3.051850947599719e-05;
          *(double *)(out_right + lVar17) =
               (double)this->m_outBuf[uVar11 * 2 + 1] * 3.051850947599719e-05;
          lVar17 = lVar17 + uVar15;
        }
        break;
      case OPNMIDI_SampleType_S24:
      case OPNMIDI_SampleType_U24:
        if (uVar3 != 4) {
          return 0;
        }
        bVar18 = OVar4 == OPNMIDI_SampleType_S24;
        transform = opn2_cvtU24;
        pcVar10 = opn2_cvtS24;
        goto LAB_001522e0;
      case OPNMIDI_SampleType_S32:
      case OPNMIDI_SampleType_U32:
        if (uVar3 != 4) {
          return 0;
        }
        bVar18 = OVar4 == OPNMIDI_SampleType_S32;
        transform = opn2_cvtU32;
        pcVar10 = opn2_cvtS32;
LAB_001522e0:
        if (bVar18) {
          transform = pcVar10;
        }
LAB_001522f2:
        CopySamplesTransformed<int,int>
                  (out_left + lVar17,out_right + lVar17,src,uVar13 >> 1,sampleOffset,transform);
      }
LAB_0015247f:
      local_80 = local_80 - s;
      uVar16 = uVar16 + uVar12;
      OPNMIDIplay::TickIterators(this,s);
    }
    iVar8 = (int)uVar16;
  }
  return iVar8;
}

Assistant:

OPNMIDI_EXPORT int opn2_generateFormat(struct OPN2_MIDIPlayer *device, int sampleCount,
                                       OPN2_UInt8 *out_left, OPN2_UInt8 *out_right,
                                       const OPNMIDI_AudioFormat *format)
{
    sampleCount -= sampleCount % 2; //Avoid even sample requests
    if(sampleCount < 0)
        return 0;
    if(!device)
        return 0;

    MidiPlayer *player = GET_MIDI_PLAYER(device);
    assert(player);
    MidiPlayer::Setup &setup = player->m_setup;

    ssize_t gotten_len = 0;
    ssize_t n_periodCountStereo = 512;

    int     left = sampleCount;
    double  delay = double(sampleCount / 2) / double(setup.PCM_RATE);

    while(left > 0)
    {
        if(delay <= 0.0)
            delay = double(left / 2) / double(setup.PCM_RATE);
        const double eat_delay = delay < setup.maxdelay ? delay : setup.maxdelay;
        delay -= eat_delay;
        setup.carry += double(setup.PCM_RATE) * eat_delay;
        n_periodCountStereo = static_cast<ssize_t>(setup.carry);
        setup.carry -= double(n_periodCountStereo);

        {
            ssize_t leftSamples = left / 2;
            if(n_periodCountStereo > leftSamples)
                n_periodCountStereo = leftSamples;
            //! Count of stereo samples
            ssize_t in_generatedStereo = (n_periodCountStereo > 512) ? 512 : n_periodCountStereo;
            //! Total count of samples
            ssize_t in_generatedPhys = in_generatedStereo * 2;
            //! Unsigned total sample count
            //fill buffer with zeros
            int32_t *out_buf = player->m_outBuf;
            std::memset(out_buf, 0, static_cast<size_t>(in_generatedPhys) * sizeof(out_buf[0]));
            Synth &synth = *player->m_synth;
            unsigned int chips = synth.m_numChips;
            if(chips == 1)
                synth.m_chips[0]->generate32(out_buf, (size_t)in_generatedStereo);
            else/* if(n_periodCountStereo > 0)*/
            {
                /* Generate data from every chip and mix result */
                for(size_t card = 0; card < chips; ++card)
                    synth.m_chips[card]->generateAndMix32(out_buf, (size_t)in_generatedStereo);
            }
            /* Process it */
            if(SendStereoAudio(sampleCount, in_generatedStereo, out_buf, gotten_len, out_left, out_right, format) == -1)
                return 0;

            left -= (int)in_generatedPhys;
            gotten_len += (in_generatedPhys) /* - setup.stored_samples*/;
        }

        player->TickIterators(eat_delay);
    }

    return static_cast<int>(gotten_len);
}